

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O1

bool bssl::set_version_bound(SSL_PROTOCOL_METHOD *method,uint16_t *out,uint16_t version)

{
  ulong uVar1;
  bool bVar2;
  uint16_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t unused;
  uint16_t local_1a;
  
  bVar2 = ssl_protocol_version_from_wire(&local_1a,version);
  if (bVar2) {
    puVar3 = &kTLSVersions;
    if (method->is_dtls != false) {
      puVar3 = &kDTLSVersions;
    }
    if (*puVar3 != version) {
      uVar4 = (ulong)((4 - (uint)method->is_dtls) * 2);
      uVar1 = 2;
      do {
        uVar5 = uVar1;
        if (uVar4 == uVar5) goto LAB_0015ef4d;
        uVar1 = uVar5 + 2;
      } while (*(uint16_t *)((long)puVar3 + uVar5) != version);
      if (uVar4 == uVar5) goto LAB_0015ef4d;
    }
    *out = version;
    bVar2 = true;
  }
  else {
LAB_0015ef4d:
    bVar2 = false;
    ERR_put_error(0x10,0,0xea,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0x89);
  }
  return bVar2;
}

Assistant:

static bool set_version_bound(const SSL_PROTOCOL_METHOD *method, uint16_t *out,
                              uint16_t version) {
  if (!api_version_to_wire(&version, version) ||
      !ssl_method_supports_version(method, version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_SSL_VERSION);
    return false;
  }

  *out = version;
  return true;
}